

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall Minisat::SimpSolver::asymmVar(SimpSolver *this,Var v)

{
  byte bVar1;
  bool bVar2;
  vec<unsigned_int,_int> *pvVar3;
  long lVar4;
  int local_1c;
  
  local_1c = v;
  if (this->use_simplification == false) {
    __assert_fail("use_simplification",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x1b5,"bool Minisat::SimpSolver::asymmVar(Var)");
  }
  pvVar3 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
           ::lookup(&this->occurs,&local_1c);
  if (local_1c <
      (this->super_Solver).assigns.super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.
      map.sz) {
    bVar1 = (this->super_Solver).assigns.
            super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data[local_1c].
            value;
    bVar2 = true;
    if ((bVar1 == l_Undef && (l_Undef & 2) == 0 || (l_Undef & 2 & bVar1) != 0) && (pvVar3->sz != 0))
    {
      if (0 < pvVar3->sz) {
        lVar4 = 0;
        do {
          bVar2 = asymm(this,local_1c,pvVar3->data[lVar4]);
          if (!bVar2) {
            return false;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < pvVar3->sz);
      }
      bVar2 = backwardSubsumptionCheck(this,false);
    }
    return bVar2;
  }
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                ,0x27,
                "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

bool SimpSolver::asymmVar(Var v)
{
    assert(use_simplification);

    const vec<CRef>& cls = occurs.lookup(v);

    if (value(v) != l_Undef || cls.size() == 0)
        return true;

    for (int i = 0; i < cls.size(); i++)
        if (!asymm(v, cls[i]))
            return false;

    return backwardSubsumptionCheck();
}